

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O1

Promise<void> kj::anon_unknown_0::expectRead(AsyncInputStream *in,StringPtr expected)

{
  PromiseArena *pPVar1;
  OwnPromiseNode OVar2;
  PromiseArena *pPVar3;
  void *pvVar4;
  _func_int **in_RCX;
  _func_int **pp_Var5;
  _func_int **elementCount;
  TransformPromiseNodeBase *this;
  Promise<unsigned_long> promise;
  Array<char> buffer;
  OwnPromiseNode local_b0;
  PromiseArena *local_a8;
  _func_int **pp_Stack_a0;
  PromiseArena *pPStack_98;
  _func_int **local_88;
  PromiseArena *pPStack_80;
  _func_int **local_78;
  PromiseArena *local_70;
  _func_int **pp_Stack_68;
  PromiseArena *pPStack_60;
  OwnPromiseNode local_58;
  _func_int **local_50;
  undefined1 local_48 [24];
  
  pp_Var5 = (_func_int **)expected.content.ptr;
  elementCount = (_func_int **)((long)in_RCX - 1);
  if (elementCount == (_func_int **)0x0) {
    kj::_::readyNow();
    in->_vptr_AsyncInputStream = local_88;
  }
  else {
    local_a8 = (PromiseArena *)
               kj::_::HeapArrayDisposer::allocateImpl
                         (1,(size_t)elementCount,(size_t)elementCount,(_func_void_void_ptr *)0x0,
                          (_func_void_void_ptr *)0x0);
    pPStack_98 = (PromiseArena *)&kj::_::HeapArrayDisposer::instance;
    pp_Stack_a0 = elementCount;
    (**(code **)(*pp_Var5 + 8))(&local_b0,pp_Var5,local_a8,1,elementCount);
    pPVar3 = local_a8;
    OVar2.ptr = local_b0.ptr;
    local_70 = local_a8;
    pp_Stack_68 = pp_Stack_a0;
    pPStack_60 = pPStack_98;
    local_a8 = (PromiseArena *)0x0;
    pp_Stack_a0 = (_func_int **)0x0;
    pPVar1 = ((local_b0.ptr)->super_PromiseArenaMember).arena;
    local_88 = pp_Var5;
    pPStack_80 = (PromiseArena *)expected.content.size_;
    local_78 = in_RCX;
    if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_b0.ptr - (long)pPVar1) < 0x50) {
      pvVar4 = operator_new(0x400);
      this = (TransformPromiseNodeBase *)((long)pvVar4 + 0x3b0);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this,&local_b0,
                 kj::_::
                 SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls-test.c++:1197:23)>
                 ::anon_class_48_3_6fe2814c_for_func::operator());
      *(undefined ***)((long)pvVar4 + 0x3b0) = &PTR_destroy_0063e020;
      *(_func_int ***)((long)pvVar4 + 0x3d0) = local_88;
      *(PromiseArena **)((long)pvVar4 + 0x3d8) = pPStack_80;
      *(_func_int ***)((long)pvVar4 + 0x3e0) = local_78;
      *(PromiseArena **)((long)pvVar4 + 1000) = pPVar3;
      *(_func_int ***)((long)pvVar4 + 0x3f0) = pp_Stack_68;
      *(PromiseArena **)((long)pvVar4 + 0x3f8) = pPStack_60;
      *(void **)((long)pvVar4 + 0x3b8) = pvVar4;
    }
    else {
      ((local_b0.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
      this = (TransformPromiseNodeBase *)(local_b0.ptr + -5);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this,&local_b0,
                 kj::_::
                 SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls-test.c++:1197:23)>
                 ::anon_class_48_3_6fe2814c_for_func::operator());
      OVar2.ptr[-5].super_PromiseArenaMember._vptr_PromiseArenaMember =
           (_func_int **)&PTR_destroy_0063e020;
      OVar2.ptr[-3].super_PromiseArenaMember._vptr_PromiseArenaMember = local_88;
      OVar2.ptr[-3].super_PromiseArenaMember.arena = pPStack_80;
      OVar2.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = local_78;
      OVar2.ptr[-2].super_PromiseArenaMember.arena = pPVar3;
      OVar2.ptr[-1].super_PromiseArenaMember._vptr_PromiseArenaMember = pp_Stack_68;
      OVar2.ptr[-1].super_PromiseArenaMember.arena = pPStack_60;
      OVar2.ptr[-5].super_PromiseArenaMember.arena = pPVar1;
    }
    pp_Stack_68 = (_func_int **)0x0;
    local_70 = (PromiseArena *)0x0;
    local_48._0_8_ = &DAT_004a8171;
    local_48._8_8_ = &DAT_004a81d0;
    local_48._16_8_ = &DAT_4c0000058b;
    local_58.ptr = &this->super_PromiseNode;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
              ((PromiseDisposer *)&local_50,&local_58,(SourceLocation *)local_48);
    OVar2.ptr = local_58.ptr;
    in->_vptr_AsyncInputStream = local_50;
    if ((TransformPromiseNodeBase *)local_58.ptr != (TransformPromiseNodeBase *)0x0) {
      local_58.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
    }
    pp_Var5 = pp_Stack_68;
    pPVar1 = local_70;
    if (local_70 != (PromiseArena *)0x0) {
      local_70 = (PromiseArena *)0x0;
      pp_Stack_68 = (_func_int **)0x0;
      (*(code *)**(undefined8 **)pPStack_60->bytes)(pPStack_60,pPVar1,1,pp_Var5,pp_Var5,0);
    }
    OVar2.ptr = local_b0.ptr;
    if (&(local_b0.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
      local_b0.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
    }
    pp_Var5 = pp_Stack_a0;
    pPVar1 = local_a8;
    if (local_a8 != (PromiseArena *)0x0) {
      local_a8 = (PromiseArena *)0x0;
      pp_Stack_a0 = (_func_int **)0x0;
      (*(code *)**(undefined8 **)pPStack_98->bytes)(pPStack_98,pPVar1,1,pp_Var5,pp_Var5,0);
    }
  }
  return (PromiseBase)(PromiseBase)in;
}

Assistant:

kj::Promise<void> expectRead(kj::AsyncInputStream& in, kj::StringPtr expected) {
  if (expected.size() == 0) return kj::READY_NOW;

  auto buffer = kj::heapArray<char>(expected.size());

  auto promise = in.tryRead(buffer.begin(), 1, buffer.size());
  return promise.then([&in,expected,buffer=kj::mv(buffer)](size_t amount) {
    if (amount == 0) {
      KJ_FAIL_ASSERT("expected data never sent", expected);
    }

    auto actual = buffer.first(amount);
    if (actual != expected.asBytes().first(amount)) {
      KJ_FAIL_ASSERT("data from stream doesn't match expected", expected, actual);
    }

    return expectRead(in, expected.slice(amount));
  });
}